

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

ostream * Hex::operator<<(ostream *os,Hexdumper<unsigned_int> *hd)

{
  ostream *poVar1;
  long lVar2;
  
  Hexdumper<unsigned_int>::dump(hd,os);
  lVar2 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 0;
  poVar1 = os + *(long *)(lVar2 + -0x18);
  if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar2 = *(long *)os;
  }
  poVar1[0xe0] = (ostream)0x0;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 8) = 0;
  *(undefined4 *)(os + *(long *)(lVar2 + -0x18) + 0x18) = 0;
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const Hexdumper<T>& hd)
    {
        hd.dump(os);

        // reset stream settings
        os.width(0);
        os.fill(0);
        os.precision(0);
        os.flags(std::ios_base::fmtflags(0));
        return os;
    }